

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_listener.cpp
# Opt level: O0

int __thiscall
zmq::tcp_listener_t::accept(tcp_listener_t *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  sockaddr *psVar5;
  bool bVar6;
  char *errstr_2;
  int rc_1;
  char *errstr_1;
  int rc;
  size_type size;
  size_type i;
  bool matched;
  char *errstr;
  fd_t sock;
  socklen_t ss_len;
  sockaddr_storage ss;
  int in_stack_ffffffffffffff30;
  fd_t in_stack_ffffffffffffff34;
  sockaddr *ss_;
  undefined7 in_stack_ffffffffffffff58;
  byte bVar7;
  socklen_t local_94;
  sockaddr local_90 [8];
  tcp_listener_t *local_10;
  int local_4;
  
  local_10 = this;
  if ((this->super_stream_listener_base_t)._s == -1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_s != retired_fd",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_listener.cpp"
            ,0xc3);
    fflush(_stderr);
    zmq_abort((char *)0x2def1a);
  }
  memset(local_90,0,0x80);
  local_94 = 0x80;
  iVar1 = accept4((this->super_stream_listener_base_t)._s,local_90,&local_94,0x80000);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    bVar6 = true;
    if (*piVar3 != 0xb) {
      piVar3 = __errno_location();
      bVar6 = true;
      if (*piVar3 != 0xb) {
        piVar3 = __errno_location();
        bVar6 = true;
        if (*piVar3 != 4) {
          piVar3 = __errno_location();
          bVar6 = true;
          if (*piVar3 != 0x67) {
            piVar3 = __errno_location();
            bVar6 = true;
            if (*piVar3 != 0x47) {
              piVar3 = __errno_location();
              bVar6 = true;
              if (*piVar3 != 0x69) {
                piVar3 = __errno_location();
                bVar6 = true;
                if (*piVar3 != 0xc) {
                  piVar3 = __errno_location();
                  bVar6 = true;
                  if (*piVar3 != 0x18) {
                    piVar3 = __errno_location();
                    bVar6 = *piVar3 == 0x17;
                  }
                }
              }
            }
          }
        }
      }
    }
    if (!bVar6) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_listener.cpp"
              ,0xe2);
      fflush(_stderr);
      zmq_abort((char *)0x2df074);
    }
    local_4 = -1;
  }
  else {
    make_socket_noninheritable(iVar1);
    bVar6 = std::vector<zmq::tcp_address_mask_t,_std::allocator<zmq::tcp_address_mask_t>_>::empty
                      ((vector<zmq::tcp_address_mask_t,_std::allocator<zmq::tcp_address_mask_t>_> *)
                       CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    if (!bVar6) {
      bVar7 = 0;
      ss_ = (sockaddr *)0x0;
      psVar5 = (sockaddr *)
               std::vector<zmq::tcp_address_mask_t,_std::allocator<zmq::tcp_address_mask_t>_>::size
                         (&(this->super_stream_listener_base_t).super_own_t.options.
                           tcp_accept_filters);
      for (; ss_ != psVar5; ss_ = (sockaddr *)((long)&ss_->sa_family + 1)) {
        std::vector<zmq::tcp_address_mask_t,_std::allocator<zmq::tcp_address_mask_t>_>::operator[]
                  (&(this->super_stream_listener_base_t).super_own_t.options.tcp_accept_filters,
                   (size_type)ss_);
        bVar6 = tcp_address_mask_t::match_address
                          ((tcp_address_mask_t *)CONCAT17(bVar7,in_stack_ffffffffffffff58),ss_,
                           (socklen_t)((ulong)psVar5 >> 0x20));
        if (bVar6) {
          bVar7 = 1;
          break;
        }
      }
      if ((bVar7 & 1) == 0) {
        iVar1 = close(iVar1);
        if (iVar1 != 0) {
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_listener.cpp"
                  ,0xfb);
          fflush(_stderr);
          zmq_abort((char *)0x2df1a6);
        }
        return -1;
      }
    }
    iVar2 = set_nosigpipe(iVar1);
    if (iVar2 == 0) {
      if ((this->super_stream_listener_base_t).super_own_t.options.tos != 0) {
        set_ip_type_of_service(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
      }
      local_4 = iVar1;
      if ((this->super_stream_listener_base_t).super_own_t.options.priority != 0) {
        set_socket_priority((fd_t)((ulong)this >> 0x20),(int)this);
      }
    }
    else {
      iVar1 = close(iVar1);
      if (iVar1 != 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_listener.cpp"
                ,0x107);
        fflush(_stderr);
        zmq_abort((char *)0x2df23d);
      }
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

zmq::fd_t zmq::tcp_listener_t::accept ()
{
    //  The situation where connection cannot be accepted due to insufficient
    //  resources is considered valid and treated by ignoring the connection.
    //  Accept one connection and deal with different failure modes.
    zmq_assert (_s != retired_fd);

    struct sockaddr_storage ss;
    memset (&ss, 0, sizeof (ss));
#if defined ZMQ_HAVE_HPUX || defined ZMQ_HAVE_VXWORKS
    int ss_len = sizeof (ss);
#else
    socklen_t ss_len = sizeof (ss);
#endif
#if defined ZMQ_HAVE_SOCK_CLOEXEC && defined HAVE_ACCEPT4
    fd_t sock = ::accept4 (_s, reinterpret_cast<struct sockaddr *> (&ss),
                           &ss_len, SOCK_CLOEXEC);
#else
    const fd_t sock =
      ::accept (_s, reinterpret_cast<struct sockaddr *> (&ss), &ss_len);
#endif

    if (sock == retired_fd) {
#if defined ZMQ_HAVE_WINDOWS
        const int last_error = WSAGetLastError ();
        wsa_assert (last_error == WSAEWOULDBLOCK || last_error == WSAECONNRESET
                    || last_error == WSAEMFILE || last_error == WSAENOBUFS);
#elif defined ZMQ_HAVE_ANDROID
        errno_assert (errno == EAGAIN || errno == EWOULDBLOCK || errno == EINTR
                      || errno == ECONNABORTED || errno == EPROTO
                      || errno == ENOBUFS || errno == ENOMEM || errno == EMFILE
                      || errno == ENFILE || errno == EINVAL);
#else
        errno_assert (errno == EAGAIN || errno == EWOULDBLOCK || errno == EINTR
                      || errno == ECONNABORTED || errno == EPROTO
                      || errno == ENOBUFS || errno == ENOMEM || errno == EMFILE
                      || errno == ENFILE);
#endif
        return retired_fd;
    }

    make_socket_noninheritable (sock);

    if (!options.tcp_accept_filters.empty ()) {
        bool matched = false;
        for (options_t::tcp_accept_filters_t::size_type
               i = 0,
               size = options.tcp_accept_filters.size ();
             i != size; ++i) {
            if (options.tcp_accept_filters[i].match_address (
                  reinterpret_cast<struct sockaddr *> (&ss), ss_len)) {
                matched = true;
                break;
            }
        }
        if (!matched) {
#ifdef ZMQ_HAVE_WINDOWS
            const int rc = closesocket (sock);
            wsa_assert (rc != SOCKET_ERROR);
#else
            int rc = ::close (sock);
            errno_assert (rc == 0);
#endif
            return retired_fd;
        }
    }

    if (zmq::set_nosigpipe (sock)) {
#ifdef ZMQ_HAVE_WINDOWS
        const int rc = closesocket (sock);
        wsa_assert (rc != SOCKET_ERROR);
#else
        int rc = ::close (sock);
        errno_assert (rc == 0);
#endif
        return retired_fd;
    }

    // Set the IP Type-Of-Service priority for this client socket
    if (options.tos != 0)
        set_ip_type_of_service (sock, options.tos);

    // Set the protocol-defined priority for this client socket
    if (options.priority != 0)
        set_socket_priority (sock, options.priority);

    return sock;
}